

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::Die(APlayerPawn *this,AActor *source,AActor *inflictor,int dmgflags)

{
  FState *pFVar1;
  bool bVar2;
  uint uVar3;
  AActor *pAVar4;
  MetaClass *type;
  AAmmo *pAVar5;
  FName local_50;
  FName local_4c;
  PClassActor *local_48;
  PClassActor *ti;
  DDropItem *di;
  AInventory *item;
  AWeapon *weap;
  AActor *pAStack_20;
  int dmgflags_local;
  AActor *inflictor_local;
  AActor *source_local;
  APlayerPawn *this_local;
  
  weap._4_4_ = dmgflags;
  pAStack_20 = inflictor;
  inflictor_local = source;
  source_local = &this->super_AActor;
  AActor::Die(&this->super_AActor,source,inflictor,dmgflags);
  if (((this->super_AActor).player != (player_t *)0x0) &&
     (((this->super_AActor).player)->mo == this)) {
    ((this->super_AActor).player)->bonuscount = 0;
  }
  if (((this->super_AActor).player == (player_t *)0x0) ||
     (((this->super_AActor).player)->mo == this)) {
    if ((((this->super_AActor).player != (player_t *)0x0) &&
        (uVar3 = FIntCVar::operator_cast_to_int(&dmflags2), (uVar3 & 2) != 0)) &&
       (item = (AInventory *)((this->super_AActor).player)->ReadyWeapon,
       (AWeapon *)item != (AWeapon *)0x0)) {
      ti = (PClassActor *)AActor::GetDropItems((AActor *)item);
      if (ti == (PClassActor *)0x0) {
        if (((item->super_AActor).SpawnState == (FState *)0x0) ||
           (pFVar1 = (item->super_AActor).SpawnState, pAVar4 = GetDefault<AActor>(),
           pFVar1 == pAVar4->SpawnState)) {
          di = (DDropItem *)
               P_DropItem(&this->super_AActor,
                          (PClassActor *)
                          item[1].super_AActor.super_DThinker.super_DObject._vptr_DObject,-1,0x100);
          if ((AInventory *)di != (AInventory *)0x0) {
            pAVar5 = TObjPtr<AAmmo>::operator->
                               ((TObjPtr<AAmmo> *)&item[1].super_AActor.SpriteRotation);
            *(int *)&di[0x13].super_DObject.Class = (pAVar5->super_AInventory).Amount;
            *(uint *)&di[0x13].Next = *(uint *)&di[0x13].Next | 0x4000;
          }
          di = (DDropItem *)
               P_DropItem(&this->super_AActor,
                          (PClassActor *)item[1].super_AActor.super_DThinker.super_DObject.Class,-1,
                          0x100);
          if ((AInventory *)di != (AInventory *)0x0) {
            pAVar5 = TObjPtr<AAmmo>::operator->
                               ((TObjPtr<AAmmo> *)&item[1].super_AActor.VisibleStartAngle);
            *(int *)&di[0x13].super_DObject.Class = (pAVar5->super_AInventory).Amount;
            *(uint *)&di[0x13].Next = *(uint *)&di[0x13].Next | 0x4000;
          }
        }
        else {
          type = AWeapon::GetClass((AWeapon *)item);
          di = (DDropItem *)P_DropItem(&this->super_AActor,(PClassActor *)type,-1,0x100);
          if (((AInventory *)di != (AInventory *)0x0) &&
             (bVar2 = DObject::IsKindOf((DObject *)di,AWeapon::RegistrationInfo.MyClass), bVar2)) {
            if ((*(int *)&item[1].super_AActor.super_DThinker.super_DObject.ObjNext != 0) &&
               (pAVar5 = ::TObjPtr::operator_cast_to_AAmmo_
                                   ((TObjPtr *)&item[1].super_AActor.SpriteRotation),
               pAVar5 != (AAmmo *)0x0)) {
              pAVar5 = TObjPtr<AAmmo>::operator->
                                 ((TObjPtr<AAmmo> *)&item[1].super_AActor.SpriteRotation);
              *(int *)&di[0x14].super_DObject.ObjNext = (pAVar5->super_AInventory).Amount;
            }
            if ((*(int *)((long)&item[1].super_AActor.super_DThinker.super_DObject.ObjNext + 4) != 0
                ) && (pAVar5 = ::TObjPtr::operator_cast_to_AAmmo_
                                         ((TObjPtr *)&item[1].super_AActor.VisibleStartAngle),
                     pAVar5 != (AAmmo *)0x0)) {
              pAVar5 = TObjPtr<AAmmo>::operator->
                                 ((TObjPtr<AAmmo> *)&item[1].super_AActor.VisibleStartAngle);
              *(int *)((long)&di[0x14].super_DObject.ObjNext + 4) =
                   (pAVar5->super_AInventory).Amount;
            }
            *(uint *)&di[0x13].Next = *(uint *)&di[0x13].Next | 0x4000;
          }
        }
      }
      else {
        for (; ti != (PClassActor *)0x0;
            ti = *(PClassActor **)
                  &(ti->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.Align) {
          bVar2 = FName::operator!=((FName *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.
                                              super_PNamedType.super_PCompoundType.super_PType.
                                              HashNext,NAME_None);
          if (bVar2) {
            FName::FName(&local_4c,
                         (FName *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.
                                   super_PNamedType.super_PCompoundType.super_PType.HashNext);
            local_48 = PClass::FindActor(&local_4c);
            if (local_48 != (PClassActor *)0x0) {
              P_DropItem(&((this->super_AActor).player)->mo->super_AActor,local_48,
                         *(int *)&(ti->super_PClass).super_PNativeStruct.super_PStruct.
                                  super_PNamedType.super_PCompoundType.super_PType.Symbols.
                                  ParentSymbolTable,
                         *(int *)((long)&(ti->super_PClass).super_PNativeStruct.super_PStruct.
                                         super_PNamedType.super_PCompoundType.super_PType.HashNext +
                                 4));
            }
          }
        }
      }
    }
    if (((multiplayer & 1U) == 0) &&
       (bVar2 = FName::operator!=(&(::level.info)->deathsequence,NAME_None), bVar2)) {
      FName::FName(&local_50,&(::level.info)->deathsequence);
      F_StartIntermission(&local_50,'\0');
    }
  }
  else {
    AActor::CallDie(&((this->super_AActor).player)->mo->super_AActor,inflictor_local,pAStack_20,
                    weap._4_4_);
  }
  return;
}

Assistant:

void APlayerPawn::Die (AActor *source, AActor *inflictor, int dmgflags)
{
	Super::Die (source, inflictor, dmgflags);

	if (player != NULL && player->mo == this) player->bonuscount = 0;

	if (player != NULL && player->mo != this)
	{ // Make the real player die, too
		player->mo->CallDie (source, inflictor, dmgflags);
	}
	else
	{
		if (player != NULL && (dmflags2 & DF2_YES_WEAPONDROP))
		{ // Voodoo dolls don't drop weapons
			AWeapon *weap = player->ReadyWeapon;
			if (weap != NULL)
			{
				AInventory *item;

				// kgDROP - start - modified copy from a_action.cpp
				DDropItem *di = weap->GetDropItems();

				if (di != NULL)
				{
					while (di != NULL)
					{
						if (di->Name != NAME_None)
						{
							PClassActor *ti = PClass::FindActor(di->Name);
							if (ti) P_DropItem (player->mo, ti, di->Amount, di->Probability);
						}
						di = di->Next;
					}
				} else
				// kgDROP - end
				if (weap->SpawnState != NULL &&
					weap->SpawnState != ::GetDefault<AActor>()->SpawnState)
				{
					item = P_DropItem (this, weap->GetClass(), -1, 256);
					if (item != NULL && item->IsKindOf(RUNTIME_CLASS(AWeapon)))
					{
						if (weap->AmmoGive1 && weap->Ammo1)
						{
							static_cast<AWeapon *>(item)->AmmoGive1 = weap->Ammo1->Amount;
						}
						if (weap->AmmoGive2 && weap->Ammo2)
						{
							static_cast<AWeapon *>(item)->AmmoGive2 = weap->Ammo2->Amount;
						}
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
				else
				{
					item = P_DropItem (this, weap->AmmoType1, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo1->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
					item = P_DropItem (this, weap->AmmoType2, -1, 256);
					if (item != NULL)
					{
						item->Amount = weap->Ammo2->Amount;
						item->ItemFlags |= IF_IGNORESKILL;
					}
				}
			}
		}
		if (!multiplayer && level.info->deathsequence != NAME_None)
		{
			F_StartIntermission(level.info->deathsequence, FSTATE_EndingGame);
		}
	}
}